

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O0

int format_align_iter(char *outptr,int maxlen,ps_alignment_iter_t *itor,double utt_start,int frate,
                     logmath_t *lmath)

{
  int iVar1;
  double dVar2;
  float64 fVar3;
  double dVar4;
  char *local_68;
  char *word;
  double dur;
  double st;
  double prob;
  int local_40;
  int score;
  int duration;
  int start;
  logmath_t *lmath_local;
  double dStack_28;
  int frate_local;
  double utt_start_local;
  ps_alignment_iter_t *itor_local;
  char *pcStack_10;
  int maxlen_local;
  char *outptr_local;
  
  _duration = lmath;
  lmath_local._4_4_ = frate;
  dStack_28 = utt_start;
  utt_start_local = (double)itor;
  itor_local._4_4_ = maxlen;
  pcStack_10 = outptr;
  iVar1 = ps_alignment_iter_seg(itor,&score,&local_40);
  dVar2 = dStack_28 + (double)score / (double)lmath_local._4_4_;
  dVar4 = (double)lmath_local._4_4_;
  fVar3 = logmath_exp(_duration,iVar1);
  local_68 = ps_alignment_iter_name((ps_alignment_iter_t *)utt_start_local);
  if (local_68 == (char *)0x0) {
    local_68 = "";
  }
  iVar1 = snprintf(pcStack_10,(long)itor_local._4_4_,
                   "{\"b\":%.3f,\"d\":%.3f,\"p\":%.3f,\"t\":\"%s\"",dVar2,(double)local_40 / dVar4,
                   fVar3,local_68);
  return iVar1;
}

Assistant:

static int
format_align_iter(char *outptr, int maxlen,
                  ps_alignment_iter_t *itor, double utt_start, int frate, logmath_t *lmath)
{
    int start, duration, score;
    double prob, st, dur;
    const char *word;

    score = ps_alignment_iter_seg(itor, &start, &duration);
    st = utt_start + (double)start / frate;
    dur = (double)duration / frate;
    prob = logmath_exp(lmath, score);
    word = ps_alignment_iter_name(itor);
    if (word == NULL)
        word = "";

    return snprintf(outptr, maxlen, HYP_FORMAT, st, dur, prob, word);
}